

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::GetBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
            *this,TEmitBufferAllocation *allocation,size_t bytes,BYTE **ppBuffer)

{
  size_t *psVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if ((uint)((int)allocation->bytesCommitted - (int)allocation->bytesUsed) < bytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x146,"(allocation->BytesFree() >= bytes)",
                       "allocation->BytesFree() >= bytes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if ((this->scriptContext != (ScriptContext *)0x0) && (allocation->recorded == false)) {
    sVar2 = allocation->bytesCommitted;
    LOCK();
    psVar1 = &this->scriptContext->threadContext->nativeCodeSize;
    *psVar1 = *psVar1 + sVar2;
    UNLOCK();
    LOCK();
    ThreadContext::processNativeCodeSize = ThreadContext::processNativeCodeSize + sVar2;
    UNLOCK();
    allocation->recorded = true;
  }
  *ppBuffer = (BYTE *)(allocation->allocation->address + allocation->bytesUsed);
  return allocation;
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc>*
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::GetBuffer(TEmitBufferAllocation *allocation, __in size_t bytes, __deref_bcount(bytes) BYTE** ppBuffer)
{
    Assert(this->criticalSection.IsLocked());

    Assert(allocation->BytesFree() >= bytes);

    // In case of ThunkEmitter the script context would be null and we don't want to track that as code size.
    if (scriptContext && !allocation->recorded)
    {
        this->scriptContext->GetThreadContext()->AddCodeSize(allocation->bytesCommitted);
        allocation->recorded = true;
    }

    // The codegen buffer is beyond the alignment section - hence, we pass this pointer.
    *ppBuffer = allocation->GetUnused();
    return allocation;
}